

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O1

void __thiscall deqp::egl::GLES2TextureSharingTest::createResource(GLES2TextureSharingTest *this)

{
  GLenum GVar1;
  Vec4 local_78;
  Texture2D local_68;
  
  local_78.m_data[0] = 1.12104e-44;
  local_78.m_data[1] = 4.2039e-45;
  tcu::Texture2D::Texture2D(&local_68,(TextureFormat *)&local_78,0x80,0x80);
  tcu::Texture2D::operator=(&this->m_texture,&local_68);
  tcu::Texture3D::~Texture3D((Texture3D *)&local_68);
  tcu::Texture2D::allocLevel(&this->m_texture,0);
  local_68.super_TextureLevelPyramid.m_format.order = R;
  local_68.super_TextureLevelPyramid.m_format.type = SNORM_INT8;
  local_68.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f80000000000000;
  local_78.m_data[0] = 1.0;
  local_78.m_data[1] = 1.0;
  local_78.m_data[2] = 1.0;
  local_78.m_data[3] = 1.0;
  tcu::fillWithComponentGradients
            ((this->m_texture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&local_68,&local_78);
  (*(this->super_GLES2SharingTest).m_gl.genTextures)(1,&this->m_glTexture);
  GVar1 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar1,"genTextures(1, &m_glTexture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x1f1);
  (*(this->super_GLES2SharingTest).m_gl.bindTexture)(0xde1,this->m_glTexture);
  GVar1 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar1,"bindTexture(GL_TEXTURE_2D, m_glTexture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x1f2);
  (*(this->super_GLES2SharingTest).m_gl.texParameteri)(0xde1,0x2802,0x2901);
  GVar1 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar1,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,499);
  (*(this->super_GLES2SharingTest).m_gl.texParameteri)(0xde1,0x2803,0x2901);
  GVar1 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar1,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,500);
  (*(this->super_GLES2SharingTest).m_gl.texParameteri)(0xde1,0x2801,0x2601);
  GVar1 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar1,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x1f5);
  (*(this->super_GLES2SharingTest).m_gl.texParameteri)(0xde1,0x2800,0x2601);
  GVar1 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar1,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x1f6);
  (*(this->super_GLES2SharingTest).m_gl.texImage2D)
            (0xde1,0,0x1908,0x80,0x80,0,0x1908,0x1401,
             (((this->m_texture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).m_data);
  GVar1 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar1,
                  "texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, m_texture.getLevel(0).getDataPtr())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x1f7);
  (*(this->super_GLES2SharingTest).m_gl.bindTexture)(0xde1,0);
  GVar1 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar1,"bindTexture(GL_TEXTURE_2D, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x1f8);
  return;
}

Assistant:

void GLES2TextureSharingTest::createResource (void)
{
	int width	= 128;
	int	height	= 128;
	m_texture = tcu::Texture2D(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), width, height);
	m_texture.allocLevel(0);

	tcu::fillWithComponentGradients(m_texture.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, genTextures(1, &m_glTexture));
	GLU_CHECK_GLW_CALL(m_gl, bindTexture(GL_TEXTURE_2D, m_glTexture));
	GLU_CHECK_GLW_CALL(m_gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT));
	GLU_CHECK_GLW_CALL(m_gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT));
	GLU_CHECK_GLW_CALL(m_gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR));
	GLU_CHECK_GLW_CALL(m_gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR));
	GLU_CHECK_GLW_CALL(m_gl, texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, m_texture.getLevel(0).getDataPtr()));
	GLU_CHECK_GLW_CALL(m_gl, bindTexture(GL_TEXTURE_2D, 0));
}